

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O0

void __thiscall SQInstance::Finalize(SQInstance *this)

{
  size_type sVar1;
  SQObjectPtr *this_00;
  long in_RDI;
  SQInteger _n_;
  SQUnsignedInteger nvalues;
  undefined8 local_18;
  
  sVar1 = sqvector<SQClassMember,_unsigned_int>::size
                    ((sqvector<SQClassMember,_unsigned_int> *)(*(long *)(in_RDI + 0x38) + 0x40));
  this_00 = (SQObjectPtr *)(ulong)sVar1;
  if (*(long *)(in_RDI + 0x38) != 0) {
    *(long *)(*(long *)(in_RDI + 0x38) + 8) = *(long *)(*(long *)(in_RDI + 0x38) + 8) + -1;
    if (*(long *)(*(long *)(in_RDI + 0x38) + 8) == 0) {
      (**(code **)(**(long **)(in_RDI + 0x38) + 0x10))();
    }
    *(undefined8 *)(in_RDI + 0x38) = 0;
  }
  for (local_18 = 0; local_18 < (long)this_00; local_18 = local_18 + 1) {
    ::SQObjectPtr::Null(this_00);
  }
  return;
}

Assistant:

void SQInstance::Finalize()
{
    SQUnsignedInteger nvalues = _class->_defaultvalues.size();
    __ObjRelease(_class);
    _NULL_SQOBJECT_VECTOR(_values,nvalues);
}